

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto3_arena_unittest::TestAllTypes_NestedMessage::_InternalSerialize
          (TestAllTypes_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int32_t iVar2;
  uint32_t *puVar3;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestAllTypes_NestedMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestAllTypes_NestedMessage *this_local;
  
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  stream_local = (EpsCopyOutputStream *)target;
  if (((*puVar3 & 1) != 0) && (iVar2 = _internal_bb(this), iVar2 != 0)) {
    iVar2 = _internal_bb(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,iVar2,target);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestAllTypes_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestAllTypes_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_arena_unittest.TestAllTypes.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // int32 bb = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (this_._internal_bb() != 0) {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_bb(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_arena_unittest.TestAllTypes.NestedMessage)
  return target;
}